

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O3

Error asmjit::x86::FormatterInternal::formatInstruction
                (String *sb,uint32_t flags,BaseEmitter *emitter,uint32_t arch,BaseInst *inst,
                Operand_ *operands,size_t opCount)

{
  uint instId;
  uint uVar1;
  Error EVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t advance;
  ulong uVar6;
  undefined1 *puVar7;
  char *pcVar8;
  Operand_ *op;
  uint uVar9;
  uint32_t uVar10;
  uint32_t count;
  uint uVar11;
  RegOnly local_40;
  uint32_t local_38 [2];
  
  instId = inst->_id;
  uVar1 = inst->_options;
  uVar4 = (ulong)uVar1;
  if (0x614 < instId) {
    local_40._signature = instId;
    EVar2 = String::appendFormat<unsigned_int>(sb,"[InstId=#%u]",&local_40._signature);
    goto LAB_0012cb97;
  }
  if (((uVar1 >> 0xb & 1) != 0) &&
     (EVar2 = String::append(sb,"{vex} ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if (((uVar1 >> 10 & 1) != 0) &&
     (EVar2 = String::append(sb,"{vex3} ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if (((uVar1 >> 0xc & 1) != 0) &&
     (EVar2 = String::append(sb,"{evex} ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if ((uVar1 >> 9 & 1) == 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      pcVar8 = "{modmr} ";
      goto LAB_0012d0f2;
    }
  }
  else {
    pcVar8 = "{modrm} ";
LAB_0012d0f2:
    EVar2 = String::append(sb,pcVar8,0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  if (((uVar1 & 0x10) != 0) && (EVar2 = String::append(sb,"short ",0xffffffffffffffff), EVar2 != 0))
  {
    return EVar2;
  }
  if (((uVar1 & 0x20) != 0) && (EVar2 = String::append(sb,"long ",0xffffffffffffffff), EVar2 != 0))
  {
    return EVar2;
  }
  if (((uVar1 >> 0x10 & 1) != 0) &&
     (EVar2 = String::append(sb,"xacquire ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if (((uVar1 >> 0x11 & 1) != 0) &&
     (EVar2 = String::append(sb,"xrelease ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if (((uVar1 >> 0xd & 1) != 0) &&
     (EVar2 = String::append(sb,"lock ",0xffffffffffffffff), EVar2 != 0)) {
    return EVar2;
  }
  if ((uVar1 & 0xc000) != 0) {
    pcVar8 = "rep ";
    if ((uVar1 >> 0xe & 1) == 0) {
      pcVar8 = "repnz ";
    }
    String::append(sb,pcVar8,0xffffffffffffffff);
    if ((inst->_extraReg)._signature != 0) {
      uVar11 = uVar1;
      EVar2 = String::append(sb,"{",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      local_40 = inst->_extraReg;
      local_38[0] = 0;
      local_38[1] = 0;
      EVar2 = formatOperand(sb,flags,emitter,uVar11,(Operand_ *)&local_40);
      if (EVar2 != 0) {
        return EVar2;
      }
      EVar2 = String::append(sb,"} ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
  }
  uVar4 = (ulong)uVar1;
  if ((uVar1 >> 0x1e & 1) != 0) {
    if ((uVar1 & 0xf000000) == 0) {
      EVar2 = String::append(sb,"rex ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    else {
      String::append(sb,"rex.",0xffffffffffffffff);
      if ((uVar1 >> 0x1a & 1) != 0) {
        String::append(sb,'r');
      }
      if ((uVar1 >> 0x19 & 1) != 0) {
        String::append(sb,'x');
      }
      if ((uVar1 >> 0x18 & 1) != 0) {
        String::append(sb,'b');
      }
      if ((uVar1 >> 0x1b & 1) != 0) {
        String::append(sb,'w');
      }
      String::append(sb,' ');
    }
  }
  EVar2 = InstAPI::instIdToString(arch,instId,sb);
LAB_0012cb97:
  if (EVar2 == 0) {
    uVar11 = 0;
    while( true ) {
      uVar10 = (uint32_t)uVar4;
      uVar4 = (ulong)uVar11;
      if ((opCount <= uVar4) || (operands[uVar4]._signature == 0)) break;
      pcVar8 = ", ";
      if (uVar4 == 0) {
        pcVar8 = " ";
      }
      EVar2 = String::append(sb,pcVar8,0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
      op = operands + uVar4;
      EVar2 = formatOperand(sb,flags,emitter,uVar10,op);
      if (EVar2 != 0) {
        return EVar2;
      }
      if (((flags & 2) == 0) || ((op->_signature & 7) != 3)) goto switchD_0012ce63_caseD_5bd;
      uVar3 = 0;
      uVar4 = 0x10;
      while( true ) {
        uVar9 = (uint)uVar4;
        if (opCount <= uVar3) break;
        uVar5 = operands[uVar3]._signature >> 0x18;
        uVar6 = (ulong)uVar5;
        if (uVar5 < uVar9) {
          uVar6 = uVar4;
        }
        if ((operands[uVar3]._signature & 7) == 1) {
          uVar4 = uVar6;
        }
        uVar3 = uVar3 + 1;
      }
      uVar3 = (uint)(byte)op->_data[0];
      switch(instId) {
      case 0x482:
switchD_0012ce2b_caseD_482:
        puVar7 = FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                 ::vpclmulqdq;
        break;
      case 0x483:
      case 0x486:
      case 0x487:
      case 0x488:
      case 0x489:
      case 0x48a:
      case 0x48b:
      case 0x48c:
      case 0x48d:
      case 0x48e:
      case 0x48f:
      case 0x490:
      case 0x491:
      case 0x49a:
      case 0x49b:
      case 0x49c:
      case 0x49d:
      case 0x4a4:
      case 0x4a5:
      case 0x4a6:
      case 0x4a7:
      case 0x4a8:
      case 0x4a9:
      case 0x4ac:
      case 0x4ad:
      case 0x4ae:
      case 0x4af:
      case 0x4b0:
      case 0x4b1:
      case 0x4b2:
      case 0x4b3:
      case 0x4b4:
      case 0x4b5:
      case 0x4b9:
        goto switchD_0012ce63_caseD_5bd;
      case 0x484:
      case 0x485:
      case 0x492:
      case 0x493:
      case 0x494:
      case 0x495:
      case 0x496:
      case 0x497:
        uVar10 = 3;
        puVar7 = "EQ";
        goto LAB_0012ceeb;
      case 0x498:
      case 0x499:
      case 0x49e:
      case 0x49f:
      case 0x4a0:
      case 0x4a1:
      case 0x4a2:
      case 0x4a3:
        uVar10 = 3;
        puVar7 = "LT";
LAB_0012ceeb:
        advance = 0;
        count = 1;
LAB_0012ceef:
        EVar2 = FormatterInternal_formatImmText(sb,uVar3,uVar10,advance,puVar7,count);
        goto LAB_0012cf74;
      case 0x4aa:
      case 0x4ab:
        puVar7 = FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                 ::vperm2x128;
        break;
      case 0x4b6:
switchD_0012ce2b_caseD_4b6:
        uVar5 = uVar9 >> 3;
LAB_0012cf66:
        uVar10 = 1;
        goto LAB_0012cf6f;
      case 0x4b7:
      case 0x4b8:
      case 0x4ba:
switchD_0012ce2b_caseD_4b7:
        uVar10 = 2;
        uVar5 = 4;
LAB_0012cf6f:
        EVar2 = FormatterInternal_formatImmShuf(sb,uVar3,uVar10,uVar5);
        goto LAB_0012cf74;
      default:
        switch(instId) {
        case 0x5b1:
        case 0x5b2:
        case 0x5b3:
        case 0x5b4:
        case 0x5b5:
        case 0x5b6:
        case 0x5b7:
        case 0x5b8:
          puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vreducexx_vrndscalexx;
LAB_0012d0aa:
          uVar10 = 3;
          goto LAB_0012d0d5;
        case 0x5b9:
        case 0x5ba:
        case 0x5bb:
        case 0x5bc:
switchD_0012ce63_caseD_5b9:
          puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vroundxx;
          goto LAB_0012d0d2;
        case 0x5bd:
        case 0x5be:
        case 0x5bf:
        case 0x5c0:
        case 0x5c1:
        case 0x5c2:
        case 0x5c3:
        case 0x5c4:
        case 0x5c5:
        case 0x5c6:
        case 0x5c7:
        case 0x5c8:
        case 0x5c9:
        case 0x5ca:
        case 0x5cb:
        case 0x5cc:
        case 0x5cd:
        case 0x5ce:
        case 0x5cf:
        case 0x5d0:
        case 0x5d1:
        case 0x5d2:
        case 0x5d3:
        case 0x5d4:
        case 0x5d5:
        case 0x5d6:
          goto switchD_0012ce63_caseD_5bd;
        case 0x5d7:
        case 0x5d8:
        case 0x5d9:
        case 0x5da:
          uVar5 = (uint)(uVar4 >> 4);
          if (uVar5 < 3) {
            uVar5 = 2;
          }
          uVar10 = 2 - (uVar9 < 0x30);
          goto LAB_0012cf6f;
        case 0x5db:
switchD_0012ce63_caseD_5db:
          count = uVar9 >> 3;
          if (7 < count) {
            count = 8;
          }
          uVar10 = 1;
          advance = 2;
          puVar7 = FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vshufpd;
          break;
        case 0x5dc:
switchD_0012ce63_caseD_5dc:
          uVar10 = 2;
          puVar7 = FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                   ::vshufps;
          advance = 4;
          count = advance;
          break;
        default:
          uVar5 = instId - 0x6c;
          if (uVar5 < 0x2f) {
            if ((0x1bUL >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
              uVar10 = 3;
              goto LAB_0012cee1;
            }
            if ((0x600000000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_0012ccb6;
          }
          else {
LAB_0012ccb6:
            uVar4 = (ulong)(instId - 0x56c);
            if (instId - 0x56c < 0x3b) {
              if ((3UL >> (uVar4 & 0x3f) & 1) != 0) goto switchD_0012ce2b_caseD_4b7;
              if ((0x600000000U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0012cf10;
              if ((0x780000000000000U >> (uVar4 & 0x3f) & 1) != 0) {
                puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                          ::vrangexx;
                goto LAB_0012d0d2;
              }
            }
            if (instId - 0x348 < 4) {
              uVar10 = 5;
LAB_0012cee1:
              puVar7 = "EQ_OQ";
              goto LAB_0012ceeb;
            }
            if (instId - 0x25e < 3) goto switchD_0012ce2b_caseD_4b7;
            if (1 < instId - 0x382) {
              if (instId == 0x22) goto switchD_0012ce2b_caseD_4b6;
              if (instId == 0x23) {
LAB_0012cf51:
                uVar5 = uVar9 >> 2;
                goto LAB_0012cf66;
              }
              if (instId != 0x1f2) {
                if (instId == 0x25d) goto switchD_0012ce2b_caseD_4b7;
                if (instId == 0x2e1) goto switchD_0012ce63_caseD_5db;
                if (instId == 0x2e2) goto switchD_0012ce63_caseD_5dc;
                if (instId == 0x336) goto switchD_0012ce2b_caseD_4b6;
                if (instId == 0x337) goto LAB_0012cf51;
                if (instId != 0x37c) {
                  if (instId == 0x475) {
                    uVar5 = uVar9 >> 2;
                    if (7 < uVar9 >> 2) {
                      uVar5 = 8;
                    }
                    goto LAB_0012cf66;
                  }
                  if (instId == 0x47b) goto LAB_0012cf10;
                  if (instId != 0x56b) {
                    if (instId - 0x2a2 < 4) goto switchD_0012ce63_caseD_5b9;
                    if (instId - 0x395 < 4) {
                      puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                                ::vfixupimmxx;
                      uVar10 = 8;
                      goto LAB_0012d0d5;
                    }
                    if (instId - 0x3e9 < 4) {
                      puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                                ::vfpclassxx;
LAB_0012d09c:
                      uVar10 = 1;
                    }
                    else {
                      if (instId - 0x401 < 4) {
                        puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                                  ::vgetmantxx;
                        goto LAB_0012d0aa;
                      }
                      if (instId != 0x1ca) {
                        if (instId == 499) goto switchD_0012ce2b_caseD_482;
                        if (instId == 0x35c) {
                          puVar7 = &FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                                    ::vroundxx;
                          goto LAB_0012d09c;
                        }
                        if (instId != 0x449) goto switchD_0012ce63_caseD_5bd;
                      }
                      uVar10 = uVar9 >> 3;
                      if (3 < uVar10) {
                        uVar10 = 4;
                      }
                      puVar7 = FormatterInternal_explainConst(asmjit::String&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                               ::vmpsadbw;
                    }
                    goto LAB_0012d0d5;
                  }
                }
                goto switchD_0012ce2b_caseD_4b7;
              }
            }
          }
LAB_0012cf10:
          uVar10 = 1;
          uVar5 = 8;
          goto LAB_0012cf6f;
        }
        goto LAB_0012ceef;
      }
LAB_0012d0d2:
      uVar10 = 2;
LAB_0012d0d5:
      EVar2 = FormatterInternal_formatImmBits(sb,uVar3,(ImmBits *)puVar7,uVar10);
LAB_0012cf74:
      if (EVar2 != 0) {
        return EVar2;
      }
switchD_0012ce63_caseD_5bd:
      if (uVar11 == 0) {
        uVar10 = 0xf00;
        if (((inst->_extraReg)._signature & 0xf00) == 0x300) {
          EVar2 = String::append(sb," {",0xffffffffffffffff);
          if (EVar2 != 0) {
            return EVar2;
          }
          EVar2 = formatRegister(sb,flags,emitter,uVar10,(inst->_extraReg)._signature >> 3 & 0x1f,
                                 (inst->_extraReg)._id);
          if (EVar2 != 0) {
            return EVar2;
          }
          EVar2 = String::append(sb,'}');
          if (EVar2 != 0) {
            return EVar2;
          }
          if ((uVar1 >> 0x17 & 1) != 0) {
            pcVar8 = "{z}";
LAB_0012d01c:
            EVar2 = String::append(sb,pcVar8,0xffffffffffffffff);
            if (EVar2 != 0) {
              return EVar2;
            }
          }
        }
        else if ((uVar1 >> 0x17 & 1) != 0) {
          pcVar8 = " {z}";
          goto LAB_0012d01c;
        }
      }
      uVar3 = op->_signature;
      uVar4 = (ulong)uVar3;
      if ((uVar3 & 0xe00000) != 0 && (uVar3 & 7) == 2) {
        uVar4 = (ulong)CONCAT31((uint3)(uVar3 >> 0x1d),(char)(uVar3 >> 0x15)) & 0xffffffffffffff07;
        local_40._signature = 1 << (sbyte)uVar4;
        EVar2 = String::appendFormat<unsigned_int>(sb," {1to%u}",&local_40._signature);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      uVar11 = uVar11 + 1;
    }
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatInstruction(
  String& sb,
  uint32_t flags,
  const BaseEmitter* emitter,
  uint32_t arch,
  const BaseInst& inst, const Operand_* operands, size_t opCount) noexcept {

  uint32_t instId = inst.id();
  uint32_t options = inst.options();

  // Format instruction options and instruction mnemonic.
  if (instId < Inst::_kIdCount) {
    // VEX|EVEX options.
    if (options & Inst::kOptionVex) ASMJIT_PROPAGATE(sb.append("{vex} "));
    if (options & Inst::kOptionVex3) ASMJIT_PROPAGATE(sb.append("{vex3} "));
    if (options & Inst::kOptionEvex) ASMJIT_PROPAGATE(sb.append("{evex} "));

    // MOD/RM and MOD/MR options
    if (options & Inst::kOptionModRM)
      ASMJIT_PROPAGATE(sb.append("{modrm} "));
    else if (options & Inst::kOptionModMR)
      ASMJIT_PROPAGATE(sb.append("{modmr} "));

    // SHORT|LONG options.
    if (options & Inst::kOptionShortForm) ASMJIT_PROPAGATE(sb.append("short "));
    if (options & Inst::kOptionLongForm) ASMJIT_PROPAGATE(sb.append("long "));

    // LOCK|XACQUIRE|XRELEASE options.
    if (options & Inst::kOptionXAcquire) ASMJIT_PROPAGATE(sb.append("xacquire "));
    if (options & Inst::kOptionXRelease) ASMJIT_PROPAGATE(sb.append("xrelease "));
    if (options & Inst::kOptionLock) ASMJIT_PROPAGATE(sb.append("lock "));

    // REP|REPNE options.
    if (options & (Inst::kOptionRep | Inst::kOptionRepne)) {
      sb.append((options & Inst::kOptionRep) ? "rep " : "repnz ");
      if (inst.hasExtraReg()) {
        ASMJIT_PROPAGATE(sb.append("{"));
        ASMJIT_PROPAGATE(formatOperand(sb, flags, emitter, arch, inst.extraReg().toReg<BaseReg>()));
        ASMJIT_PROPAGATE(sb.append("} "));
      }
    }

    // REX options.
    if (options & Inst::kOptionRex) {
      const uint32_t kRXBWMask = Inst::kOptionOpCodeR |
                                 Inst::kOptionOpCodeX |
                                 Inst::kOptionOpCodeB |
                                 Inst::kOptionOpCodeW ;
      if (options & kRXBWMask) {
        sb.append("rex.");
        if (options & Inst::kOptionOpCodeR) sb.append('r');
        if (options & Inst::kOptionOpCodeX) sb.append('x');
        if (options & Inst::kOptionOpCodeB) sb.append('b');
        if (options & Inst::kOptionOpCodeW) sb.append('w');
        sb.append(' ');
      }
      else {
        ASMJIT_PROPAGATE(sb.append("rex "));
      }
    }

    ASMJIT_PROPAGATE(InstAPI::instIdToString(arch, instId, sb));
  }
  else {
    ASMJIT_PROPAGATE(sb.appendFormat("[InstId=#%u]", unsigned(instId)));
  }

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.isNone()) break;

    ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
    ASMJIT_PROPAGATE(formatOperand(sb, flags, emitter, arch, op));

    if (op.isImm() && (flags & FormatOptions::kFlagExplainImms)) {
      uint32_t vecSize = 16;
      for (uint32_t j = 0; j < opCount; j++)
        if (operands[j].isReg())
          vecSize = Support::max<uint32_t>(vecSize, operands[j].size());
      ASMJIT_PROPAGATE(FormatterInternal_explainConst(sb, flags, instId, vecSize, op.as<Imm>()));
    }

    // Support AVX-512 masking - {k}{z}.
    if (i == 0) {
      if (inst.extraReg().group() == Reg::kGroupKReg) {
        ASMJIT_PROPAGATE(sb.append(" {"));
        ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, inst.extraReg().type(), inst.extraReg().id()));
        ASMJIT_PROPAGATE(sb.append('}'));

        if (options & Inst::kOptionZMask)
          ASMJIT_PROPAGATE(sb.append("{z}"));
      }
      else if (options & Inst::kOptionZMask) {
        ASMJIT_PROPAGATE(sb.append(" {z}"));
      }
    }

    // Support AVX-512 broadcast - {1tox}.
    if (op.isMem() && op.as<Mem>().hasBroadcast()) {
      ASMJIT_PROPAGATE(sb.appendFormat(" {1to%u}", Support::bitMask(op.as<Mem>().getBroadcast())));
    }
  }

  return kErrorOk;
}